

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.cpp
# Opt level: O2

JsErrorCode WScriptJsrt::ReportModuleCompletionCallback(JsModuleRecord module,JsValueRef exception)

{
  AutoString local_40;
  void *local_20;
  JsValueRef specifier;
  
  if (exception != (JsValueRef)0x0) {
    local_20 = (JsValueRef)0x0;
    (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetModuleHostInfo)
              (module,JsModuleHostInfo_Url,&local_20);
    AutoString::AutoString(&local_40,local_20);
    PrintException(local_40.data,JsErrorScriptException,exception);
    AutoString::~AutoString(&local_40);
  }
  return JsNoError;
}

Assistant:

JsErrorCode WScriptJsrt::ReportModuleCompletionCallback(JsModuleRecord module, JsValueRef exception)
{
    if (exception != nullptr)
    {
        JsValueRef specifier = JS_INVALID_REFERENCE;
        ChakraRTInterface::JsGetModuleHostInfo(module, JsModuleHostInfo_Url, &specifier);
        PrintException(AutoString(specifier).GetString(), JsErrorCode::JsErrorScriptException, exception);
    }
    return JsNoError;
}